

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O0

bool __thiscall spvtools::opt::analysis::CompositeConstant::IsZero(CompositeConstant *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  reference ppCVar4;
  Constant *c;
  const_iterator __end3;
  const_iterator __begin3;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *__range3;
  CompositeConstant *this_local;
  
  iVar2 = (*(this->super_Constant)._vptr_Constant[0x18])();
  __end3 = std::
           vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           ::begin((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    *)CONCAT44(extraout_var,iVar2));
  c = (Constant *)
      std::
      vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ::end((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
             *)CONCAT44(extraout_var,iVar2));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                                *)&c);
    if (!bVar1) {
      return true;
    }
    ppCVar4 = __gnu_cxx::
              __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
              ::operator*(&__end3);
    uVar3 = (*(*ppCVar4)->_vptr_Constant[0x17])();
    if ((uVar3 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
    ::operator++(&__end3);
  }
  return false;
}

Assistant:

bool IsZero() const override {
    for (const Constant* c : GetComponents()) {
      if (!c->IsZero()) {
        return false;
      }
    }
    return true;
  }